

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_set_text_color(os_color_t fg,os_color_t bg)

{
  os_color_t in_RSI;
  os_color_t in_RDI;
  char buf [4];
  size_t unaff_retaddr;
  int draw;
  
  if ((os_f_plain == 0) && (S_default_win != (osgen_txtwin_t *)0x0)) {
    osgen_xlat_color_t(in_RDI);
    draw = (int)(in_RDI >> 0x20);
    osgen_xlat_color_t(in_RSI);
    ossaddsb((osgen_txtwin_t *)fg,(char *)bg,unaff_retaddr,draw);
  }
  return;
}

Assistant:

void os_set_text_color(os_color_t fg, os_color_t bg)
{
    char buf[4];

    /* if we're in plain mode, ignore it */
    if (os_f_plain || S_default_win == 0)
        return;

    /* add the color sequence to the default window's scrollback buffer */
    buf[0] = OSGEN_COLOR;
    buf[1] = osgen_xlat_color_t(fg);
    buf[2] = osgen_xlat_color_t(bg);
    ossaddsb(S_default_win, buf, 3, TRUE);
}